

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_ruleparser.h
# Opt level: O0

void __thiscall BamTools::RuleParser::parse(RuleParser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  reference this_00;
  long in_RDI;
  RuleToken *token_1;
  RuleToken *opToken_1;
  bool foundLeftParenthesis;
  RuleToken *opToken;
  RuleToken token;
  RuleToken *in_stack_ffffffffffffff48;
  stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
  *in_stack_ffffffffffffff50;
  reference in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  byte in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  byte local_49;
  RuleToken local_30;
  
  while (bVar1 = std::
                 queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::empty((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)0x21108a), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x2110a0);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RDI + 0x20);
    RuleToken::RuleToken((RuleToken *)0x2110d1);
    while ((bVar1 = readToken((RuleParser *)
                              CONCAT17(in_stack_ffffffffffffff6f,
                                       CONCAT16(in_stack_ffffffffffffff6e,
                                                CONCAT15(in_stack_ffffffffffffff6d,
                                                         CONCAT14(in_stack_ffffffffffffff6c,
                                                                  in_stack_ffffffffffffff68)))),
                              in_stack_ffffffffffffff60), bVar1 &&
           (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0))) {
      bVar1 = isOperand(&local_30);
      if (bVar1) {
        std::
        queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
      }
      else {
        bVar1 = isOperator(&local_30);
        if (bVar1) {
          while (bVar1 = std::
                         stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                         ::empty((stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                                  *)0x2111a2), ((bVar1 ^ 0xffU) & 1) != 0) {
            std::
            stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
            ::top((stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                   *)0x2111c8);
            bVar1 = isLeftAssociative((RuleToken *)0x2111e6);
            if (bVar1) {
              iVar2 = priority(in_stack_ffffffffffffff48);
              iVar3 = priority(in_stack_ffffffffffffff48);
              if (iVar3 < iVar2) goto LAB_00211225;
            }
            else {
LAB_00211225:
              bVar1 = isRightAssociative(&local_30);
              if (!bVar1) break;
              iVar2 = priority(in_stack_ffffffffffffff48);
              iVar3 = priority(in_stack_ffffffffffffff48);
              if (iVar3 <= iVar2) break;
            }
            std::
            queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
            std::
            stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
            ::pop((stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                   *)0x21129b);
          }
          std::
          stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
          ::push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        }
        else {
          in_stack_ffffffffffffff6f = isLeftParenthesis(&local_30);
          if ((bool)in_stack_ffffffffffffff6f) {
            std::
            stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
            ::push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          }
          else {
            in_stack_ffffffffffffff6e = isRightParenthesis(&local_30);
            if ((bool)in_stack_ffffffffffffff6e) {
              local_49 = 0;
              while( true ) {
                in_stack_ffffffffffffff6d =
                     std::
                     stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                     ::empty((stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                              *)0x211339);
                in_stack_ffffffffffffff6c = 0;
                if (!(bool)in_stack_ffffffffffffff6d) {
                  in_stack_ffffffffffffff6c = local_49 ^ 0xff;
                }
                if ((in_stack_ffffffffffffff6c & 1) == 0) break;
                in_stack_ffffffffffffff60 =
                     std::
                     stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                     ::top((stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                            *)0x211375);
                bVar1 = isLeftParenthesis(in_stack_ffffffffffffff60);
                if (bVar1) {
                  local_49 = 1;
                }
                else {
                  std::
                  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::push((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
                }
                std::
                stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                ::pop((stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                       *)0x2113d1);
              }
              bamtools_noop();
            }
            else {
              bamtools_noop();
            }
          }
        }
      }
    }
    while (bVar1 = std::
                   stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                   ::empty((stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                            *)0x211408), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = std::
                stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                ::top((stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
                       *)0x21142b);
      bamtools_noop();
      std::
      queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this_00,(value_type *)in_stack_ffffffffffffff48);
      std::
      stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
      ::pop((stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
             *)0x21146d);
    }
    RuleToken::~RuleToken((RuleToken *)0x21147e);
  }
  return;
}

Assistant:

inline void RuleParser::parse()
{

    // clear out any prior data
    while (!m_ruleQueue.empty())
        m_ruleQueue.pop();

    // skip if no rule to parse
    if (m_ruleString.empty()) return;

    // start at beginning of ruleString
    m_current = m_begin;

    // iterate through tokens in rule string
    RuleToken token;
    while (readToken(token)) {

        if (token.Value.empty()) break;

        // if token is an operand
        if (isOperand(token)) m_ruleQueue.push(token.Value);

        // if token is an operator
        else if (isOperator(token)) {

            // pop any operators at top of stack with higher priority
            while (!m_operatorStack.empty()) {
                const RuleToken& opToken = m_operatorStack.top();
                if ((isLeftAssociative(token) && (priority(token) <= priority(opToken))) ||
                    (isRightAssociative(token) && (priority(token) < priority(opToken)))) {
                    m_ruleQueue.push(opToken.Value);
                    m_operatorStack.pop();
                } else
                    break;
            }

            // push current operator token onto stack
            m_operatorStack.push(token);
        }

        // if token is left parenthesis
        else if (isLeftParenthesis(token))
            m_operatorStack.push(token);

        // if token is right parenthesis
        else if (isRightParenthesis(token)) {

            bool foundLeftParenthesis = false;

            // push operators into rule queue until left parenthesis found
            while (!m_operatorStack.empty() && !foundLeftParenthesis) {
                const RuleToken& opToken = m_operatorStack.top();
                if (!isLeftParenthesis(opToken))
                    m_ruleQueue.push(opToken.Value);
                else
                    foundLeftParenthesis = true;
                m_operatorStack.pop();
            }

            // no left parenthesis found, error
            BAMTOOLS_ASSERT_MESSAGE(foundLeftParenthesis,
                                    "ERROR: Mismatched parenthesis in rule string.1");
        }

        // error: unknown operand
        else
            BAMTOOLS_ASSERT_UNREACHABLE;
    }

    // while there are still operators on stack
    while (!m_operatorStack.empty()) {
        const RuleToken& token = m_operatorStack.top();
        BAMTOOLS_ASSERT_MESSAGE((!isLeftParenthesis(token) && !isRightParenthesis(token)),
                                "ERROR: Mismatched parenthesis in rule string.2");
        m_ruleQueue.push(token.Value);
        m_operatorStack.pop();
    }
}